

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O0

int rply_vertex_callback_vec3(p_ply_argument argument)

{
  p_ply_argument in_RDI;
  double dVar1;
  float value;
  long index;
  float *buffer;
  long local_18;
  void *local_10;
  p_ply_argument local_8;
  
  local_8 = in_RDI;
  ply_get_argument_user_data(in_RDI,&local_10,(long *)0x0);
  ply_get_argument_element(local_8,(p_ply_element_conflict *)0x0,&local_18);
  dVar1 = ply_get_argument_value(local_8);
  *(float *)((long)local_10 + local_18 * 0xc) = (float)dVar1;
  return 1;
}

Assistant:

static int rply_vertex_callback_vec3(p_ply_argument argument) {
  float* buffer;
  ply_get_argument_user_data(argument, (void**)&buffer, nullptr);

  long index;
  ply_get_argument_element(argument, nullptr, &index);

  float value = (float)ply_get_argument_value(argument);
  buffer[index * 3] = value;
  return 1;
}